

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiShrinkWidthItem> *this;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiTabItemFlags IVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ImGuiID IVar19;
  ImGuiTabItem *pIVar20;
  ImGuiTabItem *pIVar21;
  char *pcVar22;
  ImGuiShrinkWidthItem *pIVar23;
  int iVar24;
  int tab_n_2;
  int tab_src_n;
  int iVar25;
  int tab_n_1;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 IVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float local_c8;
  ImGuiID local_b8;
  ImVec4 local_98;
  undefined8 local_88;
  ImVec2 local_80;
  ImGuiTabItem item_tmp;
  
  pIVar15 = GImGui;
  tab_bar->WantLayout = false;
  iVar24 = 0;
  for (iVar25 = 0; iVar3 = (tab_bar->Tabs).Size, iVar25 < iVar3; iVar25 = iVar25 + 1) {
    pIVar20 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25);
    if (pIVar20->LastFrameVisible < tab_bar->PrevFrameVisible) {
      if (pIVar20->ID == tab_bar->SelectedTabId) {
        tab_bar->SelectedTabId = 0;
      }
    }
    else {
      if (iVar25 != iVar24) {
        pIVar20 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25);
        pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
        IVar11 = pIVar20->Flags;
        iVar12 = pIVar20->LastFrameVisible;
        iVar13 = pIVar20->LastFrameSelected;
        iVar3 = pIVar20->NameOffset;
        fVar29 = pIVar20->Offset;
        fVar32 = pIVar20->Width;
        fVar27 = pIVar20->ContentWidth;
        pIVar21->ID = pIVar20->ID;
        pIVar21->Flags = IVar11;
        pIVar21->LastFrameVisible = iVar12;
        pIVar21->LastFrameSelected = iVar13;
        pIVar21->NameOffset = iVar3;
        pIVar21->Offset = fVar29;
        pIVar21->Width = fVar32;
        pIVar21->ContentWidth = fVar27;
      }
      iVar24 = iVar24 + 1;
    }
  }
  if (iVar3 != iVar24) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar24);
  }
  local_b8 = tab_bar->NextSelectedTabId;
  if (local_b8 != 0) {
    tab_bar->SelectedTabId = local_b8;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar20 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar20 != (ImGuiTabItem *)0x0) {
      iVar24 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar20);
      iVar24 = tab_bar->ReorderRequestDir + iVar24;
      if ((-1 < iVar24) && (iVar24 < (tab_bar->Tabs).Size)) {
        pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
        item_tmp.ID = pIVar20->ID;
        item_tmp.Flags = pIVar20->Flags;
        item_tmp.LastFrameVisible = pIVar20->LastFrameVisible;
        item_tmp.LastFrameSelected = pIVar20->LastFrameSelected;
        item_tmp.NameOffset = pIVar20->NameOffset;
        item_tmp.Offset = pIVar20->Offset;
        item_tmp.Width = pIVar20->Width;
        item_tmp.ContentWidth = pIVar20->ContentWidth;
        IVar19 = pIVar21->ID;
        IVar11 = pIVar21->Flags;
        iVar24 = pIVar21->LastFrameVisible;
        iVar25 = pIVar21->LastFrameSelected;
        fVar29 = pIVar21->Offset;
        fVar32 = pIVar21->Width;
        fVar27 = pIVar21->ContentWidth;
        pIVar20->NameOffset = pIVar21->NameOffset;
        pIVar20->Offset = fVar29;
        pIVar20->Width = fVar32;
        pIVar20->ContentWidth = fVar27;
        pIVar20->ID = IVar19;
        pIVar20->Flags = IVar11;
        pIVar20->LastFrameVisible = iVar24;
        pIVar20->LastFrameSelected = iVar25;
        pIVar21->ID = item_tmp.ID;
        pIVar21->Flags = item_tmp.Flags;
        pIVar21->LastFrameVisible = item_tmp.LastFrameVisible;
        pIVar21->LastFrameSelected = item_tmp.LastFrameSelected;
        pIVar21->NameOffset = item_tmp.NameOffset;
        pIVar21->Offset = item_tmp.Offset;
        pIVar21->Width = item_tmp.Width;
        pIVar21->ContentWidth = item_tmp.ContentWidth;
        if (pIVar21->ID == tab_bar->SelectedTabId) {
          local_b8 = pIVar21->ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar14 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar29 = (GImGui->Style).FramePadding.y;
    fVar32 = GImGui->FontSize;
    IVar30 = (pIVar4->DC).CursorPos;
    fVar27 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar29;
    (pIVar4->DC).CursorPos.y = fVar27;
    (tab_bar->BarRect).Min.x = fVar32 + fVar29 + (tab_bar->BarRect).Min.x;
    item_tmp.ID = (ImGuiID)(pIVar14->Style).Colors[0].x;
    item_tmp.Flags = (ImGuiTabItemFlags)(pIVar14->Style).Colors[0].y;
    uVar7 = (pIVar14->Style).Colors[0].z;
    uVar8 = (pIVar14->Style).Colors[0].w;
    item_tmp.LastFrameSelected = (int)((float)uVar8 * 0.5);
    item_tmp.LastFrameVisible = uVar7;
    iVar24 = 0;
    PushStyleColor(0,(ImVec4 *)&item_tmp);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar16 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar16) {
      pIVar20 = (ImGuiTabItem *)0x0;
      for (; iVar24 < (tab_bar->Tabs).Size; iVar24 = iVar24 + 1) {
        pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
        pcVar22 = ImGuiTabBar::GetTabName(tab_bar,pIVar21);
        local_98.x = 0.0;
        local_98.y = 0.0;
        bVar16 = Selectable(pcVar22,tab_bar->SelectedTabId == pIVar21->ID,0,(ImVec2 *)&local_98);
        if (bVar16) {
          pIVar20 = pIVar21;
        }
      }
      EndPopup();
      (pIVar4->DC).CursorPos = IVar30;
      if (pIVar20 != (ImGuiTabItem *)0x0) {
        local_b8 = pIVar20->ID;
        tab_bar->SelectedTabId = local_b8;
      }
    }
    else {
      (pIVar4->DC).CursorPos = IVar30;
    }
  }
  this = &pIVar15->ShrinkWidthBuffer;
  ImVector<ImGuiShrinkWidthItem>::resize(this,(tab_bar->Tabs).Size);
  local_c8 = 0.0;
  bVar16 = false;
  pIVar20 = (ImGuiTabItem *)0x0;
  for (iVar24 = 0; iVar24 < (tab_bar->Tabs).Size; iVar24 = iVar24 + 1) {
    pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
    if (pIVar21->LastFrameVisible < tab_bar->PrevFrameVisible) {
      __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x1a57,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    if ((pIVar20 == (ImGuiTabItem *)0x0) ||
       (pIVar20->LastFrameSelected < pIVar21->LastFrameSelected)) {
      pIVar20 = pIVar21;
    }
    if (pIVar21->ID == tab_bar->SelectedTabId) {
      bVar16 = true;
    }
    pcVar22 = ImGuiTabBar::GetTabName(tab_bar,pIVar21);
    IVar30 = TabItemCalcSize(pcVar22,((uint)pIVar21->Flags >> 0x14 & 1) == 0);
    pIVar21->ContentWidth = IVar30.x;
    if (iVar24 == 0) {
      fVar29 = 0.0;
    }
    else {
      fVar29 = (pIVar15->Style).ItemInnerSpacing.x;
    }
    local_c8 = local_c8 + IVar30.x + fVar29;
    pIVar23 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar24);
    pIVar23->Index = iVar24;
    fVar29 = pIVar21->ContentWidth;
    pIVar23 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar24);
    pIVar23->Width = fVar29;
  }
  fVar29 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar29 = (float)(-(uint)(0.0 <= fVar29) & (uint)fVar29);
  fVar29 = (float)(-(uint)(fVar29 < local_c8) & (uint)(local_c8 - fVar29));
  if ((fVar29 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    fVar29 = GImGui->FontSize * 20.0;
    iVar24 = 0;
    while (iVar25 = (tab_bar->Tabs).Size, iVar24 < iVar25) {
      pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
      fVar32 = pIVar21->ContentWidth;
      if (fVar29 <= pIVar21->ContentWidth) {
        fVar32 = fVar29;
      }
      pIVar21->Width = fVar32;
      iVar24 = iVar24 + 1;
      if (fVar32 <= 0.0) {
        __assert_fail("tab->Width > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1a7e,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
    }
  }
  else {
    ShrinkWidths((pIVar15->ShrinkWidthBuffer).Data,(pIVar15->ShrinkWidthBuffer).Size,fVar29);
    for (iVar24 = 0; iVar25 = (tab_bar->Tabs).Size, iVar24 < iVar25; iVar24 = iVar24 + 1) {
      pIVar23 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar24);
      fVar29 = pIVar23->Width;
      pIVar23 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar24);
      pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar23->Index);
      pIVar21->Width = (float)(int)fVar29;
    }
  }
  tab_bar->OffsetNextTab = 0.0;
  fVar29 = 0.0;
  fVar32 = 0.0;
  for (iVar24 = 0; iVar24 < iVar25; iVar24 = iVar24 + 1) {
    pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
    pIVar21->Offset = fVar29;
    if ((local_b8 == 0) && (local_b8 = pIVar21->ID, pIVar15->NavJustMovedToId != local_b8)) {
      local_b8 = 0;
    }
    uVar1 = pIVar21->Width;
    uVar2 = pIVar21->ContentWidth;
    fVar27 = (pIVar15->Style).ItemInnerSpacing.x;
    fVar29 = fVar29 + fVar27 + (float)uVar1;
    fVar32 = fVar32 + fVar27 + (float)uVar2;
    iVar25 = (tab_bar->Tabs).Size;
  }
  fVar27 = (pIVar15->Style).ItemInnerSpacing.x;
  fVar29 = fVar29 - fVar27;
  fVar32 = fVar32 - fVar27;
  fVar29 = (float)(-(uint)(0.0 <= fVar29) & (uint)fVar29);
  tab_bar->OffsetMax = fVar29;
  pIVar14 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar32) & (uint)fVar32);
  if (1 < iVar25) {
    fVar32 = (tab_bar->BarRect).Min.x;
    fVar27 = (tab_bar->BarRect).Max.x;
    if ((fVar27 - fVar32 < fVar29) && ((tab_bar->Flags & 0x90U) == 0x80)) {
      pIVar4 = GImGui->CurrentWindow;
      fVar33 = GImGui->FontSize + -2.0;
      fVar29 = (GImGui->Style).FramePadding.y;
      IVar30.y = fVar29 + fVar29 + GImGui->FontSize;
      IVar30.x = fVar33;
      fVar34 = fVar33 + fVar33;
      local_80 = (pIVar4->DC).CursorPos;
      fVar29 = (tab_bar->BarRect).Max.y;
      fVar28 = local_80.x;
      fVar31 = local_80.y;
      bVar6 = fVar31 < (tab_bar->BarRect).Min.y;
      bVar5 = fVar27 < fVar34 + fVar28;
      if ((fVar29 < fVar31 || (bVar6 || fVar28 < fVar32)) || bVar5) {
        item_tmp.Flags = (ImGuiTabItemFlags)(fVar29 + 0.0);
        item_tmp.ID = (ImGuiID)((GImGui->Style).ItemInnerSpacing.x + fVar27);
        PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&item_tmp,true);
      }
      item_tmp.ID = (ImGuiID)(pIVar14->Style).Colors[0].x;
      item_tmp.Flags = (ImGuiTabItemFlags)(pIVar14->Style).Colors[0].y;
      uVar9 = (pIVar14->Style).Colors[0].z;
      uVar10 = (pIVar14->Style).Colors[0].w;
      item_tmp.LastFrameSelected = (int)((float)uVar10 * 0.5);
      item_tmp.LastFrameVisible = uVar9;
      PushStyleColor(0,(ImVec4 *)&item_tmp);
      local_98.x = 0.0;
      local_98.y = 0.0;
      local_98.z = 0.0;
      local_98.w = 0.0;
      PushStyleColor(0x15,&local_98);
      local_88._0_4_ = (pIVar14->IO).KeyRepeatDelay;
      local_88._4_4_ = (pIVar14->IO).KeyRepeatRate;
      (pIVar14->IO).KeyRepeatDelay = 0.25;
      (pIVar14->IO).KeyRepeatRate = 0.2;
      fVar27 = (tab_bar->BarRect).Min.y;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar34;
      (pIVar4->DC).CursorPos.y = fVar27;
      bVar17 = ArrowButtonEx("##<",0,IVar30,3);
      fVar27 = (tab_bar->BarRect).Min.y;
      (pIVar4->DC).CursorPos.x = fVar33 + ((tab_bar->BarRect).Max.x - fVar34);
      (pIVar4->DC).CursorPos.y = fVar27;
      bVar18 = ArrowButtonEx("##>",1,IVar30,3);
      iVar24 = -(uint)bVar17;
      if (bVar18) {
        iVar24 = 1;
      }
      PopStyleColor(2);
      (pIVar14->IO).KeyRepeatDelay = (float)(undefined4)local_88;
      (pIVar14->IO).KeyRepeatRate = (float)local_88._4_4_;
      if ((fVar29 < fVar31 || (bVar6 || fVar28 < fVar32)) || bVar5) {
        PopClipRect();
      }
      if ((iVar24 == 0) ||
         (pIVar21 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId),
         pIVar21 == (ImGuiTabItem *)0x0)) {
        pIVar21 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar25 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar21);
        iVar24 = iVar24 + iVar25;
        if ((iVar24 < 0) || ((tab_bar->Tabs).Size <= iVar24)) {
          iVar24 = iVar25;
        }
        pIVar21 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
      }
      (pIVar4->DC).CursorPos = local_80;
      (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar34 + 1.0);
      if (pIVar21 != (ImGuiTabItem *)0x0) {
        local_b8 = pIVar21->ID;
        tab_bar->SelectedTabId = local_b8;
      }
    }
  }
  if (bVar16) {
    IVar19 = tab_bar->SelectedTabId;
    if (IVar19 == 0) goto LAB_00150883;
  }
  else {
    tab_bar->SelectedTabId = 0;
LAB_00150883:
    IVar19 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar19 = 0, pIVar20 != (ImGuiTabItem *)0x0)) {
      IVar19 = pIVar20->ID;
      tab_bar->SelectedTabId = IVar19;
      local_b8 = IVar19;
    }
  }
  tab_bar->VisibleTabId = IVar19;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_b8 != 0) &&
     (pIVar20 = TabBarFindTabByID(tab_bar,local_b8), pIVar20 != (ImGuiTabItem *)0x0)) {
    fVar29 = GImGui->FontSize;
    iVar24 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar20);
    fVar32 = pIVar20->Offset;
    fVar27 = fVar29;
    if (iVar24 < 1) {
      fVar27 = -0.0;
    }
    fVar28 = pIVar20->Width;
    fVar27 = fVar32 - fVar27;
    if ((tab_bar->Tabs).Size <= iVar24 + 1) {
      fVar29 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar29 = fVar32 + fVar28 + fVar29;
    if ((fVar27 < tab_bar->ScrollingTarget) ||
       (fVar32 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar32 <= fVar29 - fVar27)) {
      fVar28 = tab_bar->ScrollingAnim - fVar29;
    }
    else {
      if (fVar29 - fVar32 <= tab_bar->ScrollingTarget) goto LAB_00150974;
      fVar28 = (fVar27 - fVar32) - tab_bar->ScrollingAnim;
      fVar27 = fVar29 - fVar32;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar28) & (uint)fVar28);
    tab_bar->ScrollingTarget = fVar27;
  }
LAB_00150974:
  fVar29 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar29;
  fVar32 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar32;
  if ((fVar29 != fVar32) || (NAN(fVar29) || NAN(fVar32))) {
    fVar27 = pIVar15->FontSize;
    fVar28 = fVar27 * 70.0;
    uVar26 = -(uint)(fVar28 <= tab_bar->ScrollingSpeed);
    fVar31 = ABS(fVar32 - fVar29) / 0.3;
    fVar28 = (float)(~uVar26 & (uint)fVar28 | (uint)tab_bar->ScrollingSpeed & uVar26);
    uVar26 = -(uint)(fVar31 <= fVar28);
    fVar31 = (float)(~uVar26 & (uint)fVar31 | uVar26 & (uint)fVar28);
    tab_bar->ScrollingSpeed = fVar31;
    fVar28 = fVar32;
    if ((pIVar15->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar27 * 10.0)) {
      fVar31 = fVar31 * (pIVar15->IO).DeltaTime;
      if (fVar32 <= fVar29) {
        fVar28 = fVar29;
        if (fVar32 < fVar29) {
          fVar29 = fVar29 - fVar31;
          uVar26 = -(uint)(fVar32 <= fVar29);
          fVar28 = (float)((uint)fVar29 & uVar26 | ~uVar26 & (uint)fVar32);
        }
      }
      else {
        fVar28 = fVar29 + fVar31;
        if (fVar32 <= fVar28) {
          fVar28 = fVar32;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar28;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}